

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaWildcardPtr
xmlSchemaParseAnyAttribute(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaAnnotPtr pxVar2;
  xmlAttrPtr local_40;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaWildcardPtr ret;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlSchemaParserCtxtPtr)
                 xmlSchemaAddWildcard(ctxt,schema,XML_SCHEMA_TYPE_ANY_ATTRIBUTE,node);
    if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      for (local_40 = node->properties; local_40 != (xmlAttrPtr)0x0; local_40 = local_40->next) {
        if (local_40->ns == (xmlNs *)0x0) {
          iVar1 = xmlStrEqual(local_40->name,"id");
          if (((iVar1 == 0) && (iVar1 = xmlStrEqual(local_40->name,"namespace"), iVar1 == 0)) &&
             (iVar1 = xmlStrEqual(local_40->name,(xmlChar *)"processContents"), iVar1 == 0)) {
            xmlSchemaPIllegalAttrErr
                      (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,local_40);
          }
        }
        else {
          iVar1 = xmlStrEqual(local_40->ns->href,xmlSchemaNs);
          if (iVar1 != 0) {
            xmlSchemaPIllegalAttrErr
                      (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,local_40);
          }
        }
      }
      xmlSchemaPValAttrID(ctxt,node,"id");
      iVar1 = xmlSchemaParseWildcardNs(ctxt,schema,(xmlSchemaWildcardPtr)ctxt_local,node);
      if (iVar1 == 0) {
        attr = (xmlAttrPtr)node->children;
        if ((((xmlNodePtr)attr != (xmlNodePtr)0x0) && (((xmlNodePtr)attr)->ns != (xmlNs *)0x0)) &&
           ((iVar1 = xmlStrEqual(((xmlNodePtr)attr)->name,(xmlChar *)"annotation"), iVar1 != 0 &&
            (iVar1 = xmlStrEqual(((xmlNodePtr)attr)->ns->href,xmlSchemaNs), iVar1 != 0)))) {
          pxVar2 = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)attr,1);
          ctxt_local->error = (xmlSchemaValidityErrorFunc)pxVar2;
          attr = (xmlAttrPtr)((xmlNodePtr)attr)->next;
        }
        if (attr != (xmlAttrPtr)0x0) {
          xmlSchemaPContentErr
                    (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,node,
                     (xmlNodePtr)attr,(char *)0x0,"(annotation?)");
        }
      }
      else {
        ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlSchemaWildcardPtr)ctxt_local;
}

Assistant:

static xmlSchemaWildcardPtr
xmlSchemaParseAnyAttribute(xmlSchemaParserCtxtPtr ctxt,
                           xmlSchemaPtr schema, xmlNodePtr node)
{
    xmlSchemaWildcardPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    ret = xmlSchemaAddWildcard(ctxt, schema, XML_SCHEMA_TYPE_ANY_ATTRIBUTE,
	node);
    if (ret == NULL) {
        return (NULL);
    }
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
	        (!xmlStrEqual(attr->name, BAD_CAST "namespace")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "processContents"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * Parse the namespace list.
    */
    if (xmlSchemaParseWildcardNs(ctxt, schema, ret, node) != 0)
	return (NULL);
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        ret->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?)");
    }

    return (ret);
}